

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O0

void __thiscall VulkanUtilities::VulkanInstance::VulkanInstance(VulkanInstance *this,CreateInfo *CI)

{
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *this_00;
  VkInstance pVVar1;
  undefined *puVar2;
  PFN_vkEnumerateInstanceLayerProperties p_Var3;
  PFN_vkEnumeratePhysicalDevices p_Var4;
  bool bVar5;
  VkResult VVar6;
  VkLayerProperties *pVVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_1;
  Char *pCVar9;
  ostream *poVar10;
  undefined8 uVar11;
  reference ppcVar12;
  uint *puVar13;
  size_type sVar14;
  VkPhysicalDevice_T **ppVVar15;
  char (*pacVar16) [48];
  char *in_R8;
  char *in_stack_fffffffffffff808;
  char (*in_stack_fffffffffffff858) [3];
  char **local_748;
  char **local_740;
  undefined1 local_618 [8];
  string msg_4;
  string msg_3;
  undefined1 local_5d0 [8];
  string msg_2;
  uint32_t local_5a4;
  VkResult err;
  uint32_t PhysicalDeviceCount;
  string _msg_11;
  undefined1 local_578 [4];
  VkDebugReportFlagBitsEXT flags;
  string _msg_10;
  VkDebugUtilsMessageTypeFlagsEXT messageType;
  VkDebugUtilsMessageSeverityFlagsEXT messageSeverity;
  VkResult local_544;
  undefined1 local_540 [4];
  VkResult res;
  VkInstanceCreateInfo InstanceCreateInfo;
  VkApplicationInfo appInfo;
  string _msg_9;
  uint32_t LayerVer_2;
  char *LayerName_1;
  size_t i;
  string _msg_8;
  char *local_470;
  undefined1 local_468 [8];
  string _msg_7;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> LayerExtensions;
  char local_428 [7];
  undefined1 local_421;
  char local_420 [4];
  uint local_41c;
  char local_415;
  uint local_414;
  char local_40d;
  undefined1 local_40c [4];
  undefined1 local_408 [8];
  string _msg_6;
  string _msg_5;
  char acStack_3c0 [8];
  uint32_t LayerVer_1;
  char *LayerName;
  const_iterator __end2;
  const_iterator __begin2;
  array<const_char_*,_1UL> *__range2;
  undefined1 local_398 [4];
  uint32_t LayerVer;
  vector<const_char_*,_std::allocator<const_char_*>_> InstanceLayers;
  uint32_t MaxApiVersion;
  uint32_t ApiVersion;
  string msg_1;
  string _msg_4;
  char *ExtName_1;
  char *pcStack_328;
  uint32_t ext;
  char *ExtName;
  iterator __end1;
  iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  undefined1 local_2f9;
  char *pcStack_2f8;
  bool UsePortabilityEnumeartion;
  char *local_2f0;
  char *local_2e8;
  undefined1 local_2e0 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> InstanceExtensions;
  string _msg_3;
  undefined1 local_288 [8];
  string _msg_2;
  string _msg_1;
  undefined1 local_228 [8];
  string _msg;
  VkLayerProperties *Layer;
  iterator __end3;
  iterator __begin3;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *__range3;
  stringstream ss;
  ostream local_1d8 [376];
  undefined1 local_60 [8];
  string msg;
  char *local_38;
  VkResult local_2c;
  uint32_t local_28;
  VkResult res_1;
  uint32_t LayerCount;
  CreateInfo *local_18;
  CreateInfo *CI_local;
  VulkanInstance *this_local;
  
  local_18 = CI;
  CI_local = (CreateInfo *)this;
  std::enable_shared_from_this<VulkanUtilities::VulkanInstance>::enable_shared_from_this
            (&this->super_enable_shared_from_this<VulkanUtilities::VulkanInstance>);
  this->m_DebugMode = Disabled;
  this->m_pVkAllocator = local_18->pVkAllocator;
  this->m_VkInstance = (VkInstance)0x0;
  this->m_VkVersion = 0x400000;
  std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::vector(&this->m_Layers);
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
            (&this->m_Extensions);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->m_EnabledExtensions);
  std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::vector
            (&this->m_PhysicalDevices);
  VVar6 = volkInitialize();
  if (VVar6 != VK_SUCCESS) {
    in_R8 = "Failed to load Vulkan.";
    Diligent::LogError<true,char[23]>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x103,(char (*) [23])"Failed to load Vulkan.");
  }
  local_28 = 0;
  local_2c = (*vkEnumerateInstanceLayerProperties)(&local_28,(VkLayerProperties *)0x0);
  if (local_2c != VK_SUCCESS) {
    local_38 = VkResultToString(local_2c);
    in_stack_fffffffffffff808 = (char *)&local_38;
    in_R8 = "Failed to query layer count";
    Diligent::LogError<true,char[28],char[17],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x10c,(char (*) [28])"Failed to query layer count",
               (char (*) [17])"\nVK Error Code: ",(char **)in_stack_fffffffffffff808);
  }
  std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::resize
            (&this->m_Layers,(ulong)local_28);
  p_Var3 = vkEnumerateInstanceLayerProperties;
  pVVar7 = std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::data(&this->m_Layers)
  ;
  (*p_Var3)(&local_28,pVVar7);
  if (local_2c != VK_SUCCESS) {
    msg.field_2._8_8_ = VkResultToString(local_2c);
    in_stack_fffffffffffff808 = (char *)((long)&msg.field_2 + 8);
    in_R8 = "Failed to enumerate extensions";
    Diligent::LogError<true,char[31],char[17],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x10f,(char (*) [31])"Failed to enumerate extensions",
               (char (*) [17])"\nVK Error Code: ",(char **)in_stack_fffffffffffff808);
  }
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_28;
  Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::size(&this->m_Layers)
  ;
  if (pbVar8 != Args_1) {
    Diligent::FormatString<char[26],char[30]>
              ((string *)local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LayerCount == m_Layers.size()",(char (*) [30])Args_1);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x110;
    Diligent::DebugAssertionFailed
              (pCVar9,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x110);
    std::__cxx11::string::~string((string *)local_60);
  }
  if ((local_18->LogExtensions & 1U) != 0) {
    bVar5 = std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::empty
                      (&this->m_Layers);
    if (bVar5) {
      Diligent::FormatString<char[32]>
                ((string *)((long)&_msg_2.field_2 + 8),
                 (char (*) [32])"No Vulkan instance layers found");
      puVar2 = Diligent::DebugMessageCallback;
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        uVar11 = std::__cxx11::string::c_str();
        Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        in_R8 = (char *)Args_1;
        (*(code *)puVar2)(0,uVar11,0);
      }
      std::__cxx11::string::~string((string *)(_msg_2.field_2._M_local_buf + 8));
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&__range3);
      __end3 = std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::begin
                         (&this->m_Layers);
      Layer = (VkLayerProperties *)
              std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::end
                        (&this->m_Layers);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
                                         *)&Layer), bVar5) {
        _msg.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
             ::operator*(&__end3);
        poVar10 = std::operator<<(local_1d8,"\n    ");
        poVar10 = std::operator<<(poVar10,(char *)_msg.field_2._8_8_);
        poVar10 = std::operator<<(poVar10,' ');
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            (poVar10,*(uint *)(_msg.field_2._8_8_ + 0x100) >> 0x16 & 0x7f);
        poVar10 = std::operator<<(poVar10,'.');
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            (poVar10,*(uint *)(_msg.field_2._8_8_ + 0x100) >> 0xc & 0x3ff);
        poVar10 = std::operator<<(poVar10,'.');
        std::ostream::operator<<(poVar10,*(uint *)(_msg.field_2._8_8_ + 0x100) & 0xfff);
        __gnu_cxx::
        __normal_iterator<VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
        ::operator++(&__end3);
      }
      std::__cxx11::stringstream::str();
      Diligent::FormatString<char[35],std::__cxx11::string>
                ((string *)local_228,(Diligent *)"Available Vulkan instance layers: ",
                 (char (*) [35])((long)&_msg_1.field_2 + 8),Args_1);
      std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
      puVar2 = Diligent::DebugMessageCallback;
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        uVar11 = std::__cxx11::string::c_str();
        Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        in_R8 = (char *)Args_1;
        (*(code *)puVar2)(0,uVar11,0);
      }
      std::__cxx11::string::~string((string *)local_228);
      std::__cxx11::stringstream::~stringstream((stringstream *)&__range3);
    }
  }
  bVar5 = anon_unknown_1::EnumerateInstanceExtensions((char *)0x0,&this->m_Extensions);
  if (!bVar5) {
    in_R8 = "Failed to enumerate instance extensions";
    Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12a;
    Diligent::LogError<true,char[40]>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x12a,(char (*) [40])"Failed to enumerate instance extensions");
  }
  if ((local_18->LogExtensions & 1U) != 0) {
    bVar5 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::empty
                      (&this->m_Extensions);
    if (bVar5) {
      Diligent::FormatString<char[36]>
                ((string *)
                 &InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (char (*) [36])"No Vulkan instance extensions found");
      puVar2 = Diligent::DebugMessageCallback;
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        uVar11 = std::__cxx11::string::c_str();
        in_R8 = (char *)0x0;
        (*(code *)puVar2)(0,uVar11,0);
      }
      std::__cxx11::string::~string
                ((string *)
                 &InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      PrintExtensionsList_abi_cxx11_
                ((string *)((long)&_msg_3.field_2 + 8),(VulkanUtilities *)&this->m_Extensions,
                 (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x1,
                 (size_t)Args_1);
      Diligent::FormatString<char[39],std::__cxx11::string>
                ((string *)local_288,(Diligent *)"Supported Vulkan instance extensions: ",
                 (char (*) [39])((long)&_msg_3.field_2 + 8),Args_1);
      std::__cxx11::string::~string((string *)(_msg_3.field_2._M_local_buf + 8));
      puVar2 = Diligent::DebugMessageCallback;
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        uVar11 = std::__cxx11::string::c_str();
        in_R8 = (char *)0x0;
        (*(code *)puVar2)(0,uVar11,0);
      }
      std::__cxx11::string::~string((string *)local_288);
    }
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0);
  bVar5 = IsExtensionAvailable(this,"VK_KHR_surface");
  if (bVar5) {
    local_2e8 = "VK_KHR_surface";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0,&local_2e8);
    local_2f0 = "VK_KHR_xlib_surface";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0,&local_2f0);
    pcStack_2f8 = "VK_KHR_xcb_surface";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0,
               &stack0xfffffffffffffd08);
  }
  local_2f9 = 0;
  bVar5 = IsExtensionAvailable(this,"VK_KHR_get_physical_device_properties2");
  if (bVar5) {
    __range1 = (vector<const_char_*,_std::allocator<const_char_*>_> *)anon_var_dwarf_12cbbd;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0,
               (value_type *)&__range1);
  }
  __end1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                     ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0);
  ExtName = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                     *)&ExtName), bVar5) {
    ppcVar12 = __gnu_cxx::
               __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
               ::operator*(&__end1);
    pcStack_328 = *ppcVar12;
    bVar5 = IsExtensionAvailable(this,pcStack_328);
    if (!bVar5) {
      in_stack_fffffffffffff808 = " is not available";
      in_R8 = "Required extension ";
      Diligent::LogError<true,char[20],char_const*,char[18]>
                (false,"VulkanInstance",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
                 ,0x162,(char (*) [20])"Required extension ",&stack0xfffffffffffffcd8,
                 (char (*) [18])" is not available");
    }
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    operator++(&__end1);
  }
  if (local_18->ppExtensionNames == (char **)0x0) {
    if (local_18->ExtensionCount != 0) {
      Diligent::FormatString<char[61],unsigned_int,char[84]>
                ((string *)&MaxApiVersion,
                 (Diligent *)"Global extensions pointer is null while extensions count is ",
                 (char (*) [61])&local_18->ExtensionCount,
                 (uint *)
                 ". Please initialize \'ppInstanceExtensionNames\' member of EngineVkCreateInfo struct."
                 ,(char (*) [84])in_R8);
      pCVar9 = (Char *)std::__cxx11::string::c_str();
      Diligent::DebugAssertionFailed
                (pCVar9,"VulkanInstance",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
                 ,0x176);
      std::__cxx11::string::~string((string *)&MaxApiVersion);
    }
  }
  else {
    for (ExtName_1._4_4_ = 0; ExtName_1._4_4_ < local_18->ExtensionCount;
        ExtName_1._4_4_ = ExtName_1._4_4_ + 1) {
      _msg_4.field_2._8_8_ = local_18->ppExtensionNames[ExtName_1._4_4_];
      if ((char *)_msg_4.field_2._8_8_ != (char *)0x0) {
        bVar5 = IsExtensionAvailable(this,(char *)_msg_4.field_2._8_8_);
        if (bVar5) {
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0,
                     (value_type *)((long)&_msg_4.field_2 + 8));
        }
        else {
          Diligent::FormatString<char[11],char_const*,char[18]>
                    ((string *)((long)&msg_1.field_2 + 8),(Diligent *)"Extension ",
                     (char (*) [11])((long)&_msg_4.field_2 + 8),(char **)" is not available",
                     (char (*) [18])in_R8);
          puVar2 = Diligent::DebugMessageCallback;
          if (Diligent::DebugMessageCallback != (undefined *)0x0) {
            uVar11 = std::__cxx11::string::c_str();
            in_R8 = (char *)0x0;
            (*(code *)puVar2)(1,uVar11,0);
          }
          std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
        }
      }
    }
  }
  InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = local_18->ApiVersion;
  if ((vkEnumerateInstanceVersion == (PFN_vkEnumerateInstanceVersion)0x0) ||
     (InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x400001)) {
    InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0x400000;
  }
  else {
    InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    (*vkEnumerateInstanceVersion)
              ((uint32_t *)
               &InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    puVar13 = std::min<unsigned_int>
                        ((uint *)((long)&InstanceLayers.
                                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                         (uint *)&InstanceLayers.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = *puVar13;
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_398);
  if ((local_18->EnableDeviceSimulation & 1U) != 0) {
    __range2._4_4_ = 0;
    bVar5 = IsLayerAvailable(this,VulkanInstance::DeviceSimulationLayer,
                             (uint32_t *)((long)&__range2 + 4));
    if (bVar5) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_398,
                 &VulkanInstance::DeviceSimulationLayer);
    }
  }
  if ((local_18->EnableValidation & 1U) != 0) {
    bVar5 = IsExtensionAvailable(this,"VK_EXT_debug_utils");
    if (bVar5) {
      this->m_DebugMode = Utils;
    }
    else {
      bVar5 = IsExtensionAvailable(this,"VK_EXT_debug_report");
      if (bVar5) {
        this->m_DebugMode = Report;
      }
    }
    __begin2 = &(anonymous_namespace)::ValidationLayerNames;
    __end2 = std::array<const_char_*,_1UL>::begin
                       ((array<const_char_*,_1UL> *)&(anonymous_namespace)::ValidationLayerNames);
    LayerName = (char *)std::array<const_char_*,_1UL>::end
                                  ((array<const_char_*,_1UL> *)
                                   &(anonymous_namespace)::ValidationLayerNames);
    for (; __end2 != (const_iterator)LayerName; __end2 = __end2 + 1) {
      acStack_3c0 = (char  [8])*__end2;
      _msg_5.field_2._12_4_ = 0xffffffff;
      bVar5 = IsLayerAvailable(this,(char *)acStack_3c0,
                               (uint32_t *)(_msg_5.field_2._M_local_buf + 0xc));
      if (bVar5) {
        if ((uint)_msg_5.field_2._12_4_ < 0x404135) {
          local_40c = (undefined1  [4])((uint)_msg_5.field_2._12_4_ >> 0x16 & 0x7f);
          local_40d = '.';
          local_414 = (uint)_msg_5.field_2._12_4_ >> 0xc & 0x3ff;
          local_415 = '.';
          local_41c = _msg_5.field_2._12_4_ & 0xfff;
          local_420[0] = '\x01';
          local_420[1] = '\0';
          local_420[2] = '\0';
          local_420[3] = '\0';
          local_421 = 0x2e;
          local_428[0] = '\x04';
          local_428[1] = '\0';
          local_428[2] = '\0';
          local_428[3] = '\0';
          LayerExtensions.
          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = 0x2e;
          LayerExtensions.
          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 0x135;
          in_stack_fffffffffffff808 = (char *)&local_414;
          in_R8 = local_40c;
          Diligent::
          FormatString<char[8],char_const*,char[12],unsigned_int,char,unsigned_int,char,unsigned_int,char[36],unsigned_int,char,unsigned_int,char,unsigned_int,char[3]>
                    ((string *)local_408,(Diligent *)"Layer \'",&&stack0xfffffffffffffc40,
                     (char **)"\' version (",(char (*) [12])in_R8,(uint *)&local_40d,
                     in_stack_fffffffffffff808,(uint *)&local_415,(char *)&local_41c,
                     (uint *)") is less than the header version (",(char (*) [36])local_420,
                     (uint *)&local_421,local_428,
                     (uint *)((long)&LayerExtensions.
                                     super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                     (char *)&LayerExtensions.
                              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(uint *)0xccce78,
                     in_stack_fffffffffffff858);
          puVar2 = Diligent::DebugMessageCallback;
          if (Diligent::DebugMessageCallback != (undefined *)0x0) {
            uVar11 = std::__cxx11::string::c_str();
            in_R8 = (char *)0x0;
            (*(code *)puVar2)(1,uVar11,0);
          }
          std::__cxx11::string::~string((string *)local_408);
        }
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_398,
                   (value_type *)&stack0xfffffffffffffc40);
        if (this->m_DebugMode != Utils) {
          this_00 = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                    ((long)&_msg_7.field_2 + 8);
          std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
                    (this_00);
          bVar5 = anon_unknown_1::EnumerateInstanceExtensions((char *)acStack_3c0,this_00);
          if (bVar5) {
            bVar5 = anon_unknown_1::IsExtensionAvailable
                              ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                *)((long)&_msg_7.field_2 + 8),"VK_EXT_debug_utils");
            if (bVar5) {
              this->m_DebugMode = Utils;
            }
            if ((this->m_DebugMode == Disabled) &&
               (bVar5 = anon_unknown_1::IsExtensionAvailable
                                  ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                    *)((long)&_msg_7.field_2 + 8),"VK_EXT_debug_report"), bVar5)) {
              this->m_DebugMode = Report;
            }
          }
          else {
            Diligent::FormatString<char[36],char_const*,char[7]>
                      ((string *)local_468,(Diligent *)"Failed to enumerate extensions for ",
                       (char (*) [36])&stack0xfffffffffffffc40,(char **)" layer",(char (*) [7])in_R8
                      );
            puVar2 = Diligent::DebugMessageCallback;
            if (Diligent::DebugMessageCallback != (undefined *)0x0) {
              uVar11 = std::__cxx11::string::c_str();
              in_R8 = (char *)0x0;
              (*(code *)puVar2)(2,uVar11,0);
            }
            std::__cxx11::string::~string((string *)local_468);
          }
          std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::~vector
                    ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                     ((long)&_msg_7.field_2 + 8));
        }
      }
      else {
        Diligent::FormatString<char[18],char_const*,char[19]>
                  ((string *)((long)&_msg_6.field_2 + 8),(Diligent *)"Validation layer ",
                   (char (*) [18])&stack0xfffffffffffffc40,(char **)" is not available.",
                   (char (*) [19])in_R8);
        puVar2 = Diligent::DebugMessageCallback;
        if (Diligent::DebugMessageCallback != (undefined *)0x0) {
          uVar11 = std::__cxx11::string::c_str();
          in_R8 = (char *)0x0;
          (*(code *)puVar2)(1,uVar11,0);
        }
        std::__cxx11::string::~string((string *)(_msg_6.field_2._M_local_buf + 8));
      }
    }
    if (this->m_DebugMode == Utils) {
      local_470 = "VK_EXT_debug_utils";
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0,&local_470);
    }
    else if (this->m_DebugMode == Report) {
      _msg_8.field_2._8_8_ = anon_var_dwarf_463989;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0,
                 (value_type *)((long)&_msg_8.field_2 + 8));
    }
    else {
      in_R8 = "VK_EXT_debug_report";
      Diligent::FormatString<char[9],char[19],char[6],char[20],char[117]>
                ((string *)&i,(Diligent *)"Neither ",(char (*) [9])"VK_EXT_debug_utils",
                 (char (*) [19])" nor ",(char (*) [6])"VK_EXT_debug_report",
                 (char (*) [20])
                 " extension is available. Debug tools (validation layer message logging, performance markers, etc.) will be disabled."
                 ,(char (*) [117])in_stack_fffffffffffff808);
      puVar2 = Diligent::DebugMessageCallback;
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        uVar11 = std::__cxx11::string::c_str();
        in_R8 = (char *)0x0;
        (*(code *)puVar2)(1,uVar11,0);
      }
      std::__cxx11::string::~string((string *)&i);
    }
  }
  if (local_18->ppEnabledLayerNames != (char **)0x0) {
    for (LayerName_1 = (char *)0x0; LayerName_1 < (char *)(ulong)local_18->EnabledLayerCount;
        LayerName_1 = LayerName_1 + 1) {
      _LayerVer_2 = local_18->ppEnabledLayerNames[(long)LayerName_1];
      if (_LayerVer_2 == (char *)0x0) {
        _msg_9.field_2._12_4_ = 1;
        goto LAB_003b92c7;
      }
      _msg_9.field_2._8_4_ = 0;
      bVar5 = IsLayerAvailable(this,_LayerVer_2,(uint32_t *)(_msg_9.field_2._M_local_buf + 8));
      if (bVar5) {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_398,
                   (value_type *)&LayerVer_2);
      }
      else {
        Diligent::FormatString<char[16],char_const*,char[18]>
                  ((string *)&appInfo.engineVersion,(Diligent *)"Instance layer ",
                   (char (*) [16])&LayerVer_2,(char **)" is not available",(char (*) [18])in_R8);
        puVar2 = Diligent::DebugMessageCallback;
        if (Diligent::DebugMessageCallback != (undefined *)0x0) {
          uVar11 = std::__cxx11::string::c_str();
          in_R8 = (char *)0x0;
          (*(code *)puVar2)(1,uVar11,0);
        }
        std::__cxx11::string::~string((string *)&appInfo.engineVersion);
      }
    }
  }
  memset(&InstanceCreateInfo.ppEnabledExtensionNames,0,0x30);
  InstanceCreateInfo.ppEnabledExtensionNames._0_4_ = 0;
  appInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  appInfo._4_4_ = 0;
  appInfo.pNext = (void *)0x0;
  appInfo.pApplicationName._0_4_ = 0;
  appInfo._24_8_ = anon_var_dwarf_463a79;
  appInfo.pEngineName._0_4_ = 0x3e808;
  appInfo.pEngineName._4_4_ =
       InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_;
  memset(local_540,0,0x40);
  local_540 = (undefined1  [4])0x1;
  InstanceCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  InstanceCreateInfo._4_4_ = 0;
  InstanceCreateInfo.pNext._0_4_ = 0;
  InstanceCreateInfo._16_8_ = &InstanceCreateInfo.ppEnabledExtensionNames;
  sVar14 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                     ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0);
  InstanceCreateInfo.ppEnabledLayerNames._0_4_ = (undefined4)sVar14;
  bVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0);
  if (bVar5) {
    local_740 = (char **)0x0;
  }
  else {
    local_740 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0);
  }
  InstanceCreateInfo._48_8_ = local_740;
  sVar14 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                     ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_398);
  InstanceCreateInfo.pApplicationInfo._0_4_ = (undefined4)sVar14;
  bVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_398);
  if (bVar5) {
    local_748 = (char **)0x0;
  }
  else {
    local_748 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_398);
  }
  InstanceCreateInfo._32_8_ = local_748;
  local_544 = 0xfffffff3;
  local_544 = (*vkCreateInstance)((VkInstanceCreateInfo *)local_540,this->m_pVkAllocator,
                                  &this->m_VkInstance);
  if (local_544 != VK_SUCCESS) {
    _messageType = VkResultToString(local_544);
    Diligent::LogError<true,char[33],char[17],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x221,(char (*) [33])"Failed to create Vulkan instance",
               (char (*) [17])"\nVK Error Code: ",(char **)&messageType);
  }
  volkLoadInstance(this->m_VkInstance);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator=
            (&this->m_EnabledExtensions,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0);
  this->m_VkVersion =
       InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_;
  if (this->m_DebugMode == Utils) {
    _msg_10.field_2._12_4_ = 0x1100;
    _msg_10.field_2._8_4_ = 7;
    bVar5 = SetupDebugUtils(this->m_VkInstance,0x1100,7,local_18->IgnoreDebugMessageCount,
                            local_18->ppIgnoreDebugMessageNames,(void *)0x0);
    if (!bVar5) {
      Diligent::FormatString<char[112]>
                ((string *)local_578,
                 (char (*) [112])
                 "Failed to initialize debug utils. Validation layer message logging, performance markers, etc. will be disabled."
                );
      puVar2 = Diligent::DebugMessageCallback;
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        uVar11 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar11,0);
      }
      std::__cxx11::string::~string((string *)local_578);
    }
  }
  else if (this->m_DebugMode == Report) {
    _msg_11.field_2._12_4_ = 0xe;
    bVar5 = SetupDebugReport(this->m_VkInstance,
                             VK_DEBUG_REPORT_ERROR_BIT_EXT|
                             VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT|
                             VK_DEBUG_REPORT_WARNING_BIT_EXT,(void *)0x0);
    if (!bVar5) {
      Diligent::FormatString<char[86]>
                ((string *)&err,
                 (char (*) [86])
                 "Failed to initialize debug report. Validation layer message logging will be disabled."
                );
      puVar2 = Diligent::DebugMessageCallback;
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        uVar11 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar11,0);
      }
      std::__cxx11::string::~string((string *)&err);
    }
  }
  local_5a4 = 0;
  VVar6 = (*vkEnumeratePhysicalDevices)(this->m_VkInstance,&local_5a4,(VkPhysicalDevice *)0x0);
  if (VVar6 != VK_SUCCESS) {
    msg_2.field_2._8_8_ = VkResultToString(VVar6);
    Diligent::LogError<false,char[36],char[12],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x247,(char (*) [36])"Failed to get physical device count",
               (char (*) [12])"\nVK Error: ",(char **)((long)&msg_2.field_2 + 8));
    Diligent::FormatString<char[6]>((string *)local_5d0,(char (*) [6])0xc64d72);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar9,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x247);
    std::__cxx11::string::~string((string *)local_5d0);
  }
  if (local_5a4 == 0) {
    Diligent::LogError<true,char[40]>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x249,(char (*) [40])"No physical devices found on the system");
  }
  std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::resize
            (&this->m_PhysicalDevices,(ulong)local_5a4);
  p_Var4 = vkEnumeratePhysicalDevices;
  pVVar1 = this->m_VkInstance;
  ppVVar15 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::data
                       (&this->m_PhysicalDevices);
  VVar6 = (*p_Var4)(pVVar1,&local_5a4,ppVVar15);
  if (VVar6 != VK_SUCCESS) {
    msg_3.field_2._8_8_ = VkResultToString(VVar6);
    Diligent::LogError<false,char[37],char[12],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x24e,(char (*) [37])"Failed to enumerate physical devices",
               (char (*) [12])"\nVK Error: ",(char **)((long)&msg_3.field_2 + 8));
    Diligent::FormatString<char[6]>((string *)((long)&msg_4.field_2 + 8),(char (*) [6])0xc64d72);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar9,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x24e);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  pacVar16 = (char (*) [48])
             std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::size
                       (&this->m_PhysicalDevices);
  if (pacVar16 != (char (*) [48])(ulong)local_5a4) {
    Diligent::FormatString<char[26],char[48]>
              ((string *)local_618,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_PhysicalDevices.size() == PhysicalDeviceCount",
               (char (*) [48])(ulong)local_5a4);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar9,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x24f);
    std::__cxx11::string::~string((string *)local_618);
  }
  Diligent::GLSLangUtils::InitializeGlslang();
  _msg_9.field_2._12_4_ = 0;
LAB_003b92c7:
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_398);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_2e0);
  return;
}

Assistant:

VulkanInstance::VulkanInstance(const CreateInfo& CI) :
    m_pVkAllocator{CI.pVkAllocator}
{
#if DILIGENT_USE_VOLK
    if (volkInitialize() != VK_SUCCESS)
    {
        LOG_ERROR_AND_THROW("Failed to load Vulkan.");
    }
#endif

    {
        // Enumerate available layers
        uint32_t LayerCount = 0;

        auto res = vkEnumerateInstanceLayerProperties(&LayerCount, nullptr);
        CHECK_VK_ERROR_AND_THROW(res, "Failed to query layer count");
        m_Layers.resize(LayerCount);
        vkEnumerateInstanceLayerProperties(&LayerCount, m_Layers.data());
        CHECK_VK_ERROR_AND_THROW(res, "Failed to enumerate extensions");
        VERIFY_EXPR(LayerCount == m_Layers.size());
    }

    if (CI.LogExtensions)
    {
        if (!m_Layers.empty())
        {
            std::stringstream ss;
            for (const auto& Layer : m_Layers)
            {
                ss << "\n    "
                   << Layer.layerName << ' '
                   << VK_API_VERSION_MAJOR(Layer.specVersion) << '.'
                   << VK_API_VERSION_MINOR(Layer.specVersion) << '.'
                   << VK_API_VERSION_PATCH(Layer.specVersion);
            }
            LOG_INFO_MESSAGE("Available Vulkan instance layers: ", ss.str());
        }
        else
        {
            LOG_INFO_MESSAGE("No Vulkan instance layers found");
        }
    }

    // Enumerate available instance extensions
    if (!EnumerateInstanceExtensions(nullptr, m_Extensions))
        LOG_ERROR_AND_THROW("Failed to enumerate instance extensions");

    if (CI.LogExtensions)
    {
        if (!m_Extensions.empty())
            LOG_INFO_MESSAGE("Supported Vulkan instance extensions: ", PrintExtensionsList(m_Extensions, 1));
        else
            LOG_INFO_MESSAGE("No Vulkan instance extensions found");
    }

    std::vector<const char*> InstanceExtensions;
    if (IsExtensionAvailable(VK_KHR_SURFACE_EXTENSION_NAME))
    {
        InstanceExtensions.push_back(VK_KHR_SURFACE_EXTENSION_NAME);

        // Enable surface extensions depending on OS
#if defined(VK_USE_PLATFORM_WIN32_KHR)
        InstanceExtensions.push_back(VK_KHR_WIN32_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_ANDROID_KHR)
        InstanceExtensions.push_back(VK_KHR_ANDROID_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_WAYLAND_KHR)
        InstanceExtensions.push_back(VK_KHR_WAYLAND_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_XLIB_KHR)
        InstanceExtensions.push_back(VK_KHR_XLIB_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_XCB_KHR)
        InstanceExtensions.push_back(VK_KHR_XCB_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_METAL_EXT)
        InstanceExtensions.push_back(VK_EXT_METAL_SURFACE_EXTENSION_NAME);
#endif
    };

#if PLATFORM_MACOS
    // Beginning with the 1.3.216 Vulkan SDK, the Vulkan Loader is strictly
    // enforcing the new VK_KHR_PORTABILITY_subset extension.
    constexpr bool UsePortabilityEnumeartion = true;
#else
    constexpr bool UsePortabilityEnumeartion = false;
#endif

    if (UsePortabilityEnumeartion)
        InstanceExtensions.push_back(VK_KHR_PORTABILITY_ENUMERATION_EXTENSION_NAME);

    // This extension added to core in 1.1, but current version is 1.0
    if (IsExtensionAvailable(VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME))
    {
        InstanceExtensions.push_back(VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME);
    }

    for (const auto* ExtName : InstanceExtensions)
    {
        if (!IsExtensionAvailable(ExtName))
            LOG_ERROR_AND_THROW("Required extension ", ExtName, " is not available");
    }

    if (CI.ppExtensionNames != nullptr)
    {
        for (uint32_t ext = 0; ext < CI.ExtensionCount; ++ext)
        {
            const auto* ExtName = CI.ppExtensionNames[ext];
            if (ExtName == nullptr)
                continue;
            if (IsExtensionAvailable(ExtName))
                InstanceExtensions.push_back(ExtName);
            else
                LOG_WARNING_MESSAGE("Extension ", ExtName, " is not available");
        }
    }
    else
    {
        DEV_CHECK_ERR(CI.ExtensionCount == 0,
                      "Global extensions pointer is null while extensions count is ", CI.ExtensionCount,
                      ". Please initialize 'ppInstanceExtensionNames' member of EngineVkCreateInfo struct.");
    }

    uint32_t ApiVersion = CI.ApiVersion;
#if DILIGENT_USE_VOLK
    if (vkEnumerateInstanceVersion != nullptr && ApiVersion > VK_API_VERSION_1_0)
    {
        uint32_t MaxApiVersion = 0;
        vkEnumerateInstanceVersion(&MaxApiVersion);
        ApiVersion = std::min(ApiVersion, MaxApiVersion);
    }
    else
    {
        // Only Vulkan 1.0 is supported.
        ApiVersion = VK_API_VERSION_1_0;
    }
#else
    // Without Volk we can only use Vulkan 1.0
    ApiVersion = VK_API_VERSION_1_0;
#endif

#if DILIGENT_USE_OPENXR
    XrInstance                xrInstance            = XR_NULL_HANDLE;
    XrSystemId                xrSystemId            = XR_NULL_SYSTEM_ID;
    PFN_xrGetInstanceProcAddr xrGetInstanceProcAddr = nullptr;
    if (CI.XR.Instance != 0)
    {
        if (CI.XR.GetInstanceProcAddr == nullptr)
            LOG_ERROR_AND_THROW("xrGetInstanceProcAddr must not be null");

        static_assert(sizeof(XrInstance) == sizeof(CI.XR.Instance), "XrInstance size mismatch");
        memcpy(&xrInstance, &CI.XR.Instance, sizeof(XrInstance));
        static_assert(sizeof(XrSystemId) == sizeof(CI.XR.SystemId), "XrSystemId size mismatch");
        memcpy(&xrSystemId, &CI.XR.SystemId, sizeof(XrSystemId));
        xrGetInstanceProcAddr = reinterpret_cast<PFN_xrGetInstanceProcAddr>(CI.XR.GetInstanceProcAddr);
    }
    if (xrInstance != 0)
    {
        ApiVersion = GetRequiredOpenXRVulkanVersion(ApiVersion, xrInstance, xrSystemId, xrGetInstanceProcAddr);
    }
#endif

    std::vector<const char*> InstanceLayers;

    // Use VK_DEVSIM_FILENAME environment variable to define the simulation layer
    if (CI.EnableDeviceSimulation)
    {
        static const char* DeviceSimulationLayer = "VK_LAYER_LUNARG_device_simulation";

        uint32_t LayerVer = 0;
        if (IsLayerAvailable(DeviceSimulationLayer, LayerVer))
        {
            InstanceLayers.push_back(DeviceSimulationLayer);
        }
    }

    if (CI.EnableValidation)
    {
        if (IsExtensionAvailable(VK_EXT_DEBUG_UTILS_EXTENSION_NAME))
        {
            // Prefer VK_EXT_debug_utils
            m_DebugMode = DebugMode::Utils;
        }
        else if (IsExtensionAvailable(VK_EXT_DEBUG_REPORT_EXTENSION_NAME))
        {
            // If debug utils are unavailable (e.g. on Android), use VK_EXT_debug_report
            m_DebugMode = DebugMode::Report;
        }

        for (const auto* LayerName : ValidationLayerNames)
        {
            uint32_t LayerVer = ~0u;
            if (!IsLayerAvailable(LayerName, LayerVer))
            {
                LOG_WARNING_MESSAGE("Validation layer ", LayerName, " is not available.");
                continue;
            }

            // Beta extensions may vary and result in a crash.
            // New enums are not supported and may cause validation error.
            if (LayerVer < VK_HEADER_VERSION_COMPLETE)
            {
                LOG_WARNING_MESSAGE("Layer '", LayerName, "' version (", VK_API_VERSION_MAJOR(LayerVer), '.', VK_API_VERSION_MINOR(LayerVer), '.', VK_API_VERSION_PATCH(LayerVer),
                                    ") is less than the header version (",
                                    VK_API_VERSION_MAJOR(VK_HEADER_VERSION_COMPLETE), '.', VK_API_VERSION_MINOR(VK_HEADER_VERSION_COMPLETE), '.', VK_API_VERSION_PATCH(VK_HEADER_VERSION_COMPLETE),
                                    ").");
            }

            InstanceLayers.push_back(LayerName);

            if (m_DebugMode != DebugMode::Utils)
            {
                // On Android, VK_EXT_debug_utils extension may not be supported by the loader,
                // but supported by the layer.
                std::vector<VkExtensionProperties> LayerExtensions;
                if (EnumerateInstanceExtensions(LayerName, LayerExtensions))
                {
                    if (VulkanUtilities::IsExtensionAvailable(LayerExtensions, VK_EXT_DEBUG_UTILS_EXTENSION_NAME))
                        m_DebugMode = DebugMode::Utils;

                    if (m_DebugMode == DebugMode::Disabled && VulkanUtilities::IsExtensionAvailable(LayerExtensions, VK_EXT_DEBUG_REPORT_EXTENSION_NAME))
                        m_DebugMode = DebugMode::Report; // Resort to debug report
                }
                else
                {
                    LOG_ERROR_MESSAGE("Failed to enumerate extensions for ", LayerName, " layer");
                }
            }
        }


        if (m_DebugMode == DebugMode::Utils)
            InstanceExtensions.push_back(VK_EXT_DEBUG_UTILS_EXTENSION_NAME);
        else if (m_DebugMode == DebugMode::Report)
            InstanceExtensions.push_back(VK_EXT_DEBUG_REPORT_EXTENSION_NAME);
        else
            LOG_WARNING_MESSAGE("Neither ", VK_EXT_DEBUG_UTILS_EXTENSION_NAME, " nor ", VK_EXT_DEBUG_REPORT_EXTENSION_NAME, " extension is available. Debug tools (validation layer message logging, performance markers, etc.) will be disabled.");
    }

    if (CI.ppEnabledLayerNames != nullptr)
    {
        for (size_t i = 0; i < CI.EnabledLayerCount; ++i)
        {
            const auto* LayerName = CI.ppEnabledLayerNames[i];
            if (LayerName == nullptr)
                return;
            uint32_t LayerVer = 0;
            if (IsLayerAvailable(LayerName, LayerVer))
                InstanceLayers.push_back(LayerName);
            else
                LOG_WARNING_MESSAGE("Instance layer ", LayerName, " is not available");
        }
    }

    VkApplicationInfo appInfo{};
    appInfo.sType              = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    appInfo.pNext              = nullptr; // Pointer to an extension-specific structure.
    appInfo.pApplicationName   = nullptr;
    appInfo.applicationVersion = 0; // Developer-supplied version number of the application
    appInfo.pEngineName        = "Diligent Engine";
    appInfo.engineVersion      = DILIGENT_API_VERSION; // Developer-supplied version number of the engine used to create the application.
    appInfo.apiVersion         = ApiVersion;

    VkInstanceCreateInfo InstanceCreateInfo{};
    InstanceCreateInfo.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    InstanceCreateInfo.pNext = nullptr; // Pointer to an extension-specific structure.
    InstanceCreateInfo.flags = 0;
    if (UsePortabilityEnumeartion)
    {
        // The instance will enumerate available Vulkan Portability-compliant physical
        // devices and groups in addition to the Vulkan physical devices and groups that
        // are enumerated by default.
        InstanceCreateInfo.flags |= VK_INSTANCE_CREATE_ENUMERATE_PORTABILITY_BIT_KHR;
    }
    InstanceCreateInfo.pApplicationInfo        = &appInfo;
    InstanceCreateInfo.enabledExtensionCount   = static_cast<uint32_t>(InstanceExtensions.size());
    InstanceCreateInfo.ppEnabledExtensionNames = InstanceExtensions.empty() ? nullptr : InstanceExtensions.data();
    InstanceCreateInfo.enabledLayerCount       = static_cast<uint32_t>(InstanceLayers.size());
    InstanceCreateInfo.ppEnabledLayerNames     = InstanceLayers.empty() ? nullptr : InstanceLayers.data();

    VkResult res = VK_ERROR_UNKNOWN;
#if DILIGENT_USE_OPENXR
    if (xrInstance != XR_NULL_HANDLE)
    {
        res = CreateVkInstanceForOpenXR(xrInstance, xrSystemId, xrGetInstanceProcAddr, &InstanceCreateInfo, m_pVkAllocator, &m_VkInstance);
    }
    else
#endif
    {
        res = vkCreateInstance(&InstanceCreateInfo, m_pVkAllocator, &m_VkInstance);
    }
    CHECK_VK_ERROR_AND_THROW(res, "Failed to create Vulkan instance");

#if DILIGENT_USE_VOLK
    volkLoadInstance(m_VkInstance);
#endif

    m_EnabledExtensions = std::move(InstanceExtensions);
    m_VkVersion         = ApiVersion;

    // If requested, we enable the default validation layers for debugging
    if (m_DebugMode == DebugMode::Utils)
    {
        constexpr VkDebugUtilsMessageSeverityFlagsEXT messageSeverity =
            VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT |
            VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT;
        constexpr VkDebugUtilsMessageTypeFlagsEXT messageType =
            VK_DEBUG_UTILS_MESSAGE_TYPE_GENERAL_BIT_EXT |
            VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT |
            VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT;
        if (!VulkanUtilities::SetupDebugUtils(m_VkInstance, messageSeverity, messageType, CI.IgnoreDebugMessageCount, CI.ppIgnoreDebugMessageNames, nullptr))
            LOG_ERROR_MESSAGE("Failed to initialize debug utils. Validation layer message logging, performance markers, etc. will be disabled.");
    }
    else if (m_DebugMode == DebugMode::Report)
    {
        constexpr VkDebugReportFlagBitsEXT flags = static_cast<VkDebugReportFlagBitsEXT>(
            VK_DEBUG_REPORT_WARNING_BIT_EXT |
            VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT |
            VK_DEBUG_REPORT_ERROR_BIT_EXT);
        if (!VulkanUtilities::SetupDebugReport(m_VkInstance, flags, nullptr))
            LOG_ERROR_MESSAGE("Failed to initialize debug report. Validation layer message logging will be disabled.");
    }

    // Enumerate physical devices
    {
        // Physical device
        uint32_t PhysicalDeviceCount = 0;
        // Get the number of available physical devices
        auto err = vkEnumeratePhysicalDevices(m_VkInstance, &PhysicalDeviceCount, nullptr);
        CHECK_VK_ERROR(err, "Failed to get physical device count");
        if (PhysicalDeviceCount == 0)
            LOG_ERROR_AND_THROW("No physical devices found on the system");

        // Enumerate devices
        m_PhysicalDevices.resize(PhysicalDeviceCount);
        err = vkEnumeratePhysicalDevices(m_VkInstance, &PhysicalDeviceCount, m_PhysicalDevices.data());
        CHECK_VK_ERROR(err, "Failed to enumerate physical devices");
        VERIFY_EXPR(m_PhysicalDevices.size() == PhysicalDeviceCount);
    }
#if !DILIGENT_NO_GLSLANG
    Diligent::GLSLangUtils::InitializeGlslang();
#endif
}